

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ReportFailureInUnknownLocation(Type result_type,string *message)

{
  string *message_00;
  Type result_type_00;
  UnitTest *this;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *message_local;
  Type result_type_local;
  
  local_18 = message;
  message_local._4_4_ = result_type;
  this = UnitTest::GetInstance();
  result_type_00 = message_local._4_4_;
  message_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  UnitTest::AddTestPartResult(this,result_type_00,(char *)0x0,-1,message_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void ReportFailureInUnknownLocation(TestPartResult::Type result_type,
                                    const std::string& message) {
  // This function is a friend of UnitTest and as such has access to
  // AddTestPartResult.
  UnitTest::GetInstance()->AddTestPartResult(
      result_type,
      NULL,  // No info about the source file where the exception occurred.
      -1,    // We have no info on which line caused the exception.
      message,
      "");   // No stack trace, either.
}